

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectbox.hpp
# Opt level: O1

bool __thiscall
obx::Box<objectbox::tsdemo::NamedTimeRange>::get
          (Box<objectbox::tsdemo::NamedTimeRange> *this,obx_id id,NamedTimeRange *outObject)

{
  int err;
  size_t size;
  void *data;
  CursorTx ctx;
  size_t local_58;
  void *local_50;
  CursorTx local_48;
  
  anon_unknown_3::CursorTx::CursorTx(&local_48,READ,(this->super_BoxTypeless).store_,1);
  err = obx_cursor_get(local_48.cCursor_,id,&local_50,&local_58);
  if ((err != 0) && (err != 0x194)) {
    internal::throwLastError(err,(char *)0x0);
  }
  if (err != 0x194) {
    objectbox::tsdemo::NamedTimeRange::_OBX_MetaInfo::fromFlatBuffer(local_50,local_58,outObject);
  }
  anon_unknown_3::CursorTx::~CursorTx(&local_48);
  return err != 0x194;
}

Assistant:

bool get(obx_id id, EntityT& outObject) {
        CursorTx ctx(TxMode::READ, store_, EntityBinding::entityId());
        const void* data;
        size_t size;
        if (!get(ctx, id, &data, &size)) return false;
        EntityBinding::fromFlatBuffer(data, size, outObject);
        return true;
    }